

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::base::RegisteredLoggers::~RegisteredLoggers(RegisteredLoggers *this)

{
  ~RegisteredLoggers(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~RegisteredLoggers(void) {
    unsafeFlushAll();
  }